

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O0

void ymt::UpdateUsers(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  bool local_87a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_830;
  string local_788;
  string local_768;
  undefined1 local_748 [8];
  Parser user;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  byte local_4b9;
  string local_4b8;
  byte local_493;
  byte local_492;
  allocator local_491;
  string local_490;
  string local_470;
  allocator local_449;
  string local_448;
  string local_428;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_403;
  undefined1 local_402;
  allocator local_401;
  allocator local_400;
  allocator local_3ff;
  allocator local_3fe;
  allocator local_3fd;
  allocator local_3fc;
  allocator local_3fb;
  allocator local_3fa;
  allocator local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  iterator local_2d0;
  size_type local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  string local_2a8;
  string local_288;
  undefined1 local_268 [8];
  YAML l;
  string local_200;
  size_t local_1e0;
  size_t slash_pos;
  string *line;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_1a8;
  undefined1 local_188 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  yaml_content;
  Parser default_config;
  
  Parser::Parser((Parser *)
                 &yaml_content.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)&local_1a8,(string *)&config__abi_cxx11_);
  util::ReadFile((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_188,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_188);
  line = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&line), bVar1) {
    slash_pos = (size_t)__gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end1);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_1e0 = std::__cxx11::string::find((char *)slash_pos,0x122e18);
      if (local_1e0 != 0xffffffffffffffff) {
        std::__cxx11::string::string
                  ((string *)(l.right.field_2._M_local_buf + 8),(string *)slash_pos);
        util::SubString(&local_200,(string *)((long)&l.right.field_2 + 8),0,local_1e0);
        std::__cxx11::string::operator=((string *)slash_pos,(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)(l.right.field_2._M_local_buf + 8));
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_288,(string *)slash_pos);
        util::DecodeYamlLine((YAML *)local_268,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        if (local_268 == (undefined1  [8])0x0) {
          std::__cxx11::string::string((string *)&local_2a8,(string *)&l);
          local_402 = 1;
          local_3f8 = &local_3f0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3f0,"group",&local_3f9);
          local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3d0,"nameserver",&local_3fa);
          local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3b0,"method",&local_3fb);
          local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_390,"fastopen",&local_3fc);
          local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_370,"redirect",&local_3fd);
          local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_350,"timeout",&local_3fe);
          local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_330,"server",&local_3ff);
          local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_310,"tunnel_mode",&local_400);
          local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f0,"verbose",&local_401);
          local_402 = 0;
          local_2d0 = &local_3f0;
          local_2c8 = 9;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_403);
          __l._M_len = local_2c8;
          __l._M_array = local_2d0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_2c0,__l,&local_403);
          iVar2 = util::MatchWithWords(&local_2a8,&local_2c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2c0);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_403);
          local_830 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2d0;
          do {
            local_830 = local_830 + -1;
            std::__cxx11::string::~string((string *)local_830);
          } while (local_830 != &local_3f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_401);
          std::allocator<char>::~allocator((allocator<char> *)&local_400);
          std::allocator<char>::~allocator((allocator<char> *)&local_3ff);
          std::allocator<char>::~allocator((allocator<char> *)&local_3fe);
          std::allocator<char>::~allocator((allocator<char> *)&local_3fd);
          std::allocator<char>::~allocator((allocator<char> *)&local_3fc);
          std::allocator<char>::~allocator((allocator<char> *)&local_3fb);
          std::allocator<char>::~allocator((allocator<char> *)&local_3fa);
          std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
          std::__cxx11::string::~string((string *)&local_2a8);
          switch(iVar2) {
          case 0:
            std::__cxx11::string::string
                      ((string *)&local_428,(string *)(l.left.field_2._M_local_buf + 8));
            Parser::SetAttribute
                      ((Parser *)
                       &yaml_content.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,GROUP_NAME,&local_428);
            std::__cxx11::string::~string((string *)&local_428);
            break;
          case 1:
            std::allocator<char>::allocator();
            local_492 = 0;
            local_493 = 0;
            local_4b9 = 0;
            std::__cxx11::string::string((string *)&local_448,"localhost",&local_449);
            std::__cxx11::string::string
                      ((string *)&local_470,(string *)(l.left.field_2._M_local_buf + 8));
            bVar1 = util::IsTheSame(&local_448,&local_470,false,false);
            local_87a = true;
            if (!bVar1) {
              std::allocator<char>::allocator();
              local_492 = 1;
              std::__cxx11::string::string((string *)&local_490,"bind9-local",&local_491);
              local_493 = 1;
              std::__cxx11::string::string
                        ((string *)&local_4b8,(string *)(l.left.field_2._M_local_buf + 8));
              local_4b9 = 1;
              local_87a = util::IsTheSame(&local_490,&local_4b8,false,false);
            }
            if ((local_4b9 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_4b8);
            }
            if ((local_493 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_490);
            }
            if ((local_492 & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_491);
            }
            std::__cxx11::string::~string((string *)&local_470);
            std::__cxx11::string::~string((string *)&local_448);
            std::allocator<char>::~allocator((allocator<char> *)&local_449);
            if (local_87a == false) {
              std::__cxx11::string::string
                        ((string *)&local_500,(string *)(l.left.field_2._M_local_buf + 8));
              Parser::SetAttribute
                        ((Parser *)
                         &yaml_content.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,DNS,&local_500);
              std::__cxx11::string::~string((string *)&local_500);
            }
            else {
              util::GetMachineIP_abi_cxx11_();
              Parser::SetAttribute
                        ((Parser *)
                         &yaml_content.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,DNS,&local_4e0);
              std::__cxx11::string::~string((string *)&local_4e0);
            }
            break;
          case 2:
            std::__cxx11::string::string
                      ((string *)&local_520,(string *)(l.left.field_2._M_local_buf + 8));
            Parser::SetAttribute
                      ((Parser *)
                       &yaml_content.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,METHOD,&local_520);
            std::__cxx11::string::~string((string *)&local_520);
            break;
          case 3:
            std::__cxx11::string::string
                      ((string *)&local_540,(string *)(l.left.field_2._M_local_buf + 8));
            Parser::SetAttribute
                      ((Parser *)
                       &yaml_content.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,TCP_FASTOPEN,&local_540);
            std::__cxx11::string::~string((string *)&local_540);
            break;
          case 4:
            std::__cxx11::string::string
                      ((string *)&local_560,(string *)(l.left.field_2._M_local_buf + 8));
            Parser::SetAttribute
                      ((Parser *)
                       &yaml_content.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,REDIRECT,&local_560);
            std::__cxx11::string::~string((string *)&local_560);
            break;
          case 5:
            std::__cxx11::string::string
                      ((string *)&local_580,(string *)(l.left.field_2._M_local_buf + 8));
            Parser::SetAttribute
                      ((Parser *)
                       &yaml_content.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,TIMEOUT,&local_580);
            std::__cxx11::string::~string((string *)&local_580);
            break;
          case 6:
            std::__cxx11::string::string
                      ((string *)&local_5a0,(string *)(l.left.field_2._M_local_buf + 8));
            Parser::SetAttribute
                      ((Parser *)
                       &yaml_content.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,SERVER,&local_5a0);
            std::__cxx11::string::~string((string *)&local_5a0);
            break;
          case 7:
            std::__cxx11::string::string
                      ((string *)&local_5c0,(string *)(l.left.field_2._M_local_buf + 8));
            Parser::SetAttribute
                      ((Parser *)
                       &yaml_content.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,UDP_OR_TCP,&local_5c0);
            std::__cxx11::string::~string((string *)&local_5c0);
            break;
          case 8:
            std::__cxx11::string::string
                      ((string *)&user.mode,(string *)(l.left.field_2._M_local_buf + 8));
            Parser::SetAttribute
                      ((Parser *)
                       &yaml_content.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,VERBOSE,
                       (string *)&user.mode);
            std::__cxx11::string::~string((string *)&user.mode);
          }
        }
        else {
          Parser::Parser((Parser *)local_748,
                         (Parser *)
                         &yaml_content.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::string((string *)&local_768,(string *)&l);
          std::__cxx11::string::string
                    ((string *)&local_788,(string *)(l.left.field_2._M_local_buf + 8));
          Parser::SetUser((Parser *)local_748,&local_768,&local_788);
          std::__cxx11::string::~string((string *)&local_788);
          std::__cxx11::string::~string((string *)&local_768);
          std::vector<Parser,_std::allocator<Parser>_>::push_back(&users_,(value_type *)local_748);
          Parser::~Parser((Parser *)local_748);
        }
        YAML::~YAML((YAML *)local_268);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_188);
  Parser::~Parser((Parser *)
                  &yaml_content.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ymt::UpdateUsers() {

	//Make template configuration (Can be modified by config)
	Parser default_config;

	//Read raw config
	vector <string> yaml_content = util::ReadFile(config_);

	//Parse YAML
	for (string& line : yaml_content) {

		//Skip blanklines & comments
		if (line.empty()) continue;
		else {
			size_t slash_pos = line.find("//");
			if (slash_pos != -1) {
				line = util::SubString(line, 0, slash_pos);
			}
			if (line.empty()) continue;
		}


		YAML l = util::DecodeYamlLine(line);

		//If it is global level -- no user
		if (l.level == 0) {
			switch (util::MatchWithWords(l.left,
										 { "group",
										  "nameserver",
										  "method",
										  "fastopen",
										  "redirect",
										  "timeout",
										  "server",
										  "tunnel_mode",
										  "verbose" })) {
			case 0:
				default_config.SetAttribute(GROUP_NAME, l.right);
				break;
			case 1:
				if (util::IsTheSame("localhost", l.right, false, false) ||
					util::IsTheSame("bind9-local", l.right, false, false)) {
					default_config.SetAttribute(DNS, util::GetMachineIP());
				}
				else {
					default_config.SetAttribute(DNS, l.right);
				}
				break;
			case 2:
				default_config.SetAttribute(METHOD, l.right);
				break;
			case 3:
				default_config.SetAttribute(TCP_FASTOPEN, l.right);
				break;
			case 4:
				default_config.SetAttribute(REDIRECT, l.right);
				break;
			case 5:
				default_config.SetAttribute(TIMEOUT, l.right);
				break;
			case 6:
				default_config.SetAttribute(SERVER, l.right);
				break;
			case 7:
				default_config.SetAttribute(UDP_OR_TCP, l.right);
				break;
			case 8:
				default_config.SetAttribute(VERBOSE, l.right);
				break;

			default:
				break;
			}
		}
		else {
			Parser user = default_config;
			user.SetUser(l.left, l.right);
			users_.push_back(user);
		}
	}
}